

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodes.c
# Opt level: O3

void ror_6E(void)

{
  ubyte uVar1;
  ubyte uVar2;
  ubyte uVar3;
  byte bVar4;
  
  uVar1 = carry_f;
  except = '\0';
  uVar2 = getbyte(pc);
  uVar3 = getbyte(pc + 1);
  tempint = CONCAT11(uVar3,uVar2);
  bVar4 = getbyte(tempint);
  result_f = (bVar4 >> 1) + 0x80;
  if (uVar1 == '\0') {
    result_f = bVar4 >> 1;
  }
  carry_f = bVar4 & 1;
  putbyte(result_f,tempint);
  pc = pc + 2;
  return;
}

Assistant:

void ror_6E(void) {
    ubyte oldcar;
    CLE;

    oldcar = carry_f;
    result_f = getbyte(tempint = getbyte(pc) + 0x100 * getbyte(pc + 1));

    carry_f = result_f & 1;
    result_f >>= 1;
    if (oldcar) result_f |= 0x80;

    putbyte(result_f, tempint);
    pc += 2;
}